

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_compile_op(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp env)

{
  undefined8 uVar1;
  undefined8 env_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  bool bVar2;
  sexp ctx2;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp ast;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  sexp in_stack_ffffffffffffff88;
  sexp_uint_t in_stack_ffffffffffffff90;
  sexp psVar3;
  sexp in_stack_ffffffffffffffa0;
  sexp_conflict x;
  sexp env_01;
  sexp stack;
  sexp_conflict ctx_00;
  undefined8 local_8;
  
  memset(&stack0xffffffffffffffb8,0,0x10);
  stack = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  psVar3 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff88,0,0x10);
  if ((sexp)in_R8 == (sexp)0x0) {
    in_R8 = *(ulong *)(in_RDI + 0x10);
  }
  if (((in_R8 & 3) == 0) && (((sexp)in_R8)->tag == 0x17)) {
    uVar1 = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffb8;
    x = (sexp_conflict)&stack0xffffffffffffffb0;
    env_01 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa0;
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff88;
    local_8 = sexp_make_eval_context
                        ((sexp)&stack0xffffffffffffffc8,stack,env_01,(sexp_uint_t)x,
                         (sexp_uint_t)psVar3);
    if (((local_8 & 3) != 0) || (((sexp)local_8)->tag != 0x13)) {
      ctx_00 = *(sexp_conflict *)(in_RDI + 0x20);
      *(undefined8 *)(in_RDI + 0x20) = local_8;
      env_00 = sexp_analyze((sexp)local_8,
                            (sexp)CONCAT17(in_stack_ffffffffffffff7f,
                                           CONCAT16(in_stack_ffffffffffffff7e,
                                                    in_stack_ffffffffffffff78)));
      if (((env_00 & 3) != 0) || (((sexp)env_00)->tag != 0x13)) {
        psVar3 = (((((sexp)local_8)->value).type.setters)->value).opcode.dl;
        while( true ) {
          bVar2 = false;
          if ((((ulong)psVar3 & 3) == 0) && (bVar2 = false, psVar3->tag == 6)) {
            bVar2 = false;
            if ((env_00 & 3) == 0) {
              bVar2 = ((sexp)env_00)->tag == 0x13;
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if (!bVar2) break;
          env_00 = sexp_apply1(ctx_00,env_01,x);
          psVar3 = (psVar3->value).type.cpl;
        }
        if (((env_00 & 3) != 0) || (((sexp)env_00)->tag != 0x13)) {
          env_00 = sexp_generate_op((sexp)in_RSI,(sexp)in_RDX,in_RCX,(sexp)in_R8,(sexp)env_00);
        }
      }
      *(sexp_conflict *)(in_RDI + 0x20) = ctx_00;
      *(sexp_uint_t *)(in_RDI + 0x60b0) = (((sexp)local_8)->value).context.last_fp;
      local_8 = env_00;
    }
    *(undefined8 *)(in_RDI + 0x6080) = uVar1;
  }
  else {
    local_8 = sexp_type_exception(in_stack_ffffffffffffffa0,psVar3,in_stack_ffffffffffffff90,
                                  in_stack_ffffffffffffff88);
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_compile_op (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp env) {
  sexp_gc_var3(ast, tmp, res);
  sexp ctx2;
  if (! env) env = sexp_context_env(ctx);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  sexp_gc_preserve3(ctx, ast, tmp, res);
  ctx2 = sexp_make_eval_context(ctx, NULL, env, 0, 0);
  if (sexp_exceptionp(ctx2)) {
    res = ctx2;
  } else {
    tmp = sexp_context_child(ctx);
    sexp_context_child(ctx) = ctx2;
    ast = sexp_analyze(ctx2, obj);
    if (sexp_exceptionp(ast)) {
      res = ast;
    } else {
      res = sexp_global(ctx2, SEXP_G_OPTIMIZATIONS);
      for ( ; sexp_pairp(res) && !sexp_exceptionp(ast); res=sexp_cdr(res))
        ast = sexp_apply1(ctx2, sexp_cdar(res), ast);
      if (sexp_exceptionp(ast)) {
        res = ast;
      } else {
        res = sexp_generate_op(ctx2, self, n, ast, ctx2);
      }
    }
    sexp_context_child(ctx) = tmp;
    sexp_context_last_fp(ctx) = sexp_context_last_fp(ctx2);
  }
  sexp_gc_release3(ctx);
  return res;
}